

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

int t2_decode_packets(opj_t2_t *t2,uchar *src,int len,int tileno,opj_tcd_tile_t *tile,
                     opj_codestream_info_t *cstr_info)

{
  long lVar1;
  long lVar2;
  opj_bool oVar3;
  opj_pi_iterator_t *poVar4;
  int in_ECX;
  long in_RSI;
  opj_cp_t *in_RDI;
  long in_R9;
  opj_packet_info_t *info_PK;
  opj_tile_info_t *info_TL;
  opj_packet_info_t *pack_info;
  opj_cp_t *cp;
  opj_image_t *image;
  uchar *in_stack_00000040;
  int tp_start_packno;
  int curtp;
  int n;
  int e;
  int pino;
  opj_pi_iterator_t *pi;
  uchar *c;
  opj_pi_iterator_t *in_stack_ffffffffffffff68;
  long local_90;
  int local_84;
  long *in_stack_ffffffffffffff80;
  opj_cp_t *in_stack_ffffffffffffff88;
  opj_pi_iterator_t *in_stack_ffffffffffffff90;
  int local_54;
  int local_50;
  int local_48;
  int local_44;
  long local_38;
  int local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_48 = 0;
  local_50 = 0;
  lVar1 = *(long *)&in_RDI->img_size;
  lVar2 = *(long *)&in_RDI->tp_on;
  poVar4 = pi_create_decode((opj_image_t *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (int)((ulong)in_RSI >> 0x20));
  if (poVar4 == (opj_pi_iterator_t *)0x0) {
    local_18 = -999;
  }
  else {
    local_54 = 0;
    local_38 = in_RSI;
    for (local_44 = 0; local_18 = (int)in_RSI,
        local_44 <= *(int *)(*(long *)(lVar2 + 0x80) + (long)in_ECX * 0x15e8 + 0x1a4);
        local_44 = local_44 + 1) {
      while (oVar3 = pi_next(in_stack_ffffffffffffff68), oVar3 != 0) {
        if ((*(int *)(lVar2 + 0x28) == 0) || (poVar4[local_44].layno + 1 <= *(int *)(lVar2 + 0x28)))
        {
          if (in_R9 == 0) {
            in_stack_ffffffffffffff68 = (opj_pi_iterator_t *)0x0;
          }
          else {
            in_stack_ffffffffffffff68 =
                 (opj_pi_iterator_t *)
                 (*(long *)(*(long *)(in_R9 + 0x68) + (long)in_ECX * 0x260 + 0x228) +
                 (long)*(int *)(in_R9 + 8) * 0x20);
          }
          in_stack_ffffffffffffff90 = in_stack_ffffffffffffff68;
          local_48 = t2_decode_packet(_curtp,in_stack_00000040,image._4_4_,(opj_tcd_tile_t *)cp,
                                      (opj_tcp_t *)pack_info,(opj_pi_iterator_t *)info_TL,
                                      (opj_packet_info_t *)c);
        }
        else {
          local_48 = 0;
        }
        if (local_48 == -999) {
          return -999;
        }
        if (local_48 < 1) {
          local_84 = *(int *)(*(long *)(lVar1 + 0x18) + (long)poVar4[local_44].compno * 0x38 + 0x24)
          ;
        }
        else {
          local_84 = int_max(poVar4[local_44].resno,
                             *(int *)(*(long *)(lVar1 + 0x18) + (long)poVar4[local_44].compno * 0x38
                                     + 0x24));
        }
        *(int *)(*(long *)(lVar1 + 0x18) + (long)poVar4[local_44].compno * 0x38 + 0x24) = local_84;
        if (in_R9 != 0) {
          in_stack_ffffffffffffff88 = (opj_cp_t *)(*(long *)(in_R9 + 0x68) + (long)in_ECX * 0x260);
          in_stack_ffffffffffffff80 =
               (long *)(*(long *)&in_stack_ffffffffffffff88[3].ppm_previous +
                       (long)*(int *)(in_R9 + 8) * 0x20);
          if (*(int *)(in_R9 + 8) == 0) {
            *in_stack_ffffffffffffff80 = (long)(*(int *)&in_stack_ffffffffffffff88->tp_on + 1);
          }
          else if (*(long *)(*(long *)&in_stack_ffffffffffffff88[3].ppm_previous +
                             (long)(*(int *)(in_R9 + 8) + -1) * 0x20 + 0x10) <
                   (long)*(int *)(*(long *)(*(long *)(in_R9 + 0x68) + (long)in_ECX * 0x260 + 600) +
                                  (long)local_50 * 0x14 + 8)) {
            if ((*(char *)(lVar2 + 0x10) == '\0') || (*in_stack_ffffffffffffff80 == 0)) {
              local_90 = *(long *)(*(long *)&in_stack_ffffffffffffff88[3].ppm_previous +
                                   (long)(*(int *)(in_R9 + 8) + -1) * 0x20 + 0x10) + 1;
            }
            else {
              local_90 = *in_stack_ffffffffffffff80;
            }
            *in_stack_ffffffffffffff80 = local_90;
          }
          else {
            *(int *)(*(long *)&in_stack_ffffffffffffff88[4].disto_alloc + (long)local_50 * 0x14 +
                    0x10) = *(int *)(in_R9 + 8) - local_54;
            *(int *)(*(long *)&in_stack_ffffffffffffff88[4].disto_alloc + (long)local_50 * 0x14 +
                    0xc) = local_54;
            local_54 = *(int *)(in_R9 + 8);
            local_50 = local_50 + 1;
            *in_stack_ffffffffffffff80 =
                 (long)(*(int *)(*(long *)(*(long *)(in_R9 + 0x68) + (long)in_ECX * 0x260 + 600) +
                                 (long)local_50 * 0x14 + 4) + 1);
          }
          in_stack_ffffffffffffff80[2] = *in_stack_ffffffffffffff80 + (long)local_48 + -1;
          in_stack_ffffffffffffff80[1] =
               *in_stack_ffffffffffffff80 + -1 + in_stack_ffffffffffffff80[1];
          *(int *)(in_R9 + 8) = *(int *)(in_R9 + 8) + 1;
        }
        if (local_48 == -999) break;
        local_38 = local_38 + local_48;
      }
    }
    if (in_R9 != 0) {
      *(int *)(*(long *)(*(long *)(in_R9 + 0x68) + (long)in_ECX * 0x260 + 600) +
               (long)local_50 * 0x14 + 0x10) = *(int *)(in_R9 + 8) - local_54;
      *(int *)(*(long *)(*(long *)(in_R9 + 0x68) + (long)in_ECX * 0x260 + 600) +
               (long)local_50 * 0x14 + 0xc) = local_54;
    }
    pi_destroy(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    if (local_48 == -999) {
      local_18 = -999;
    }
    else {
      local_18 = (int)local_38 - local_18;
    }
  }
  return local_18;
}

Assistant:

int t2_decode_packets(opj_t2_t *t2, unsigned char *src, int len, int tileno, opj_tcd_tile_t *tile, opj_codestream_info_t *cstr_info) {
	unsigned char *c = src;
	opj_pi_iterator_t *pi;
	int pino, e = 0;
	int n = 0, curtp = 0;
	int tp_start_packno;

	opj_image_t *image = t2->image;
	opj_cp_t *cp = t2->cp;
	
	/* create a packet iterator */
	pi = pi_create_decode(image, cp, tileno);
	if(!pi) {
		/* TODO: throw an error */
		return -999;
	}

	tp_start_packno = 0;
	
	for (pino = 0; pino <= cp->tcps[tileno].numpocs; pino++) {
		while (pi_next(&pi[pino])) {
			if ((cp->layer==0) || (cp->layer>=((pi[pino].layno)+1))) {
				opj_packet_info_t *pack_info;
				if (cstr_info)
					pack_info = &cstr_info->tile[tileno].packet[cstr_info->packno];
				else
					pack_info = NULL;
				e = t2_decode_packet(t2, c, src + len - c, tile, &cp->tcps[tileno], &pi[pino], pack_info);
			} else {
				e = 0;
			}
			if(e == -999) return -999;
			/* progression in resolution */
			image->comps[pi[pino].compno].resno_decoded =	
				(e > 0) ? 
				int_max(pi[pino].resno, image->comps[pi[pino].compno].resno_decoded) 
				: image->comps[pi[pino].compno].resno_decoded;
			n++;

			/* INDEX >> */
			if(cstr_info) {
				opj_tile_info_t *info_TL = &cstr_info->tile[tileno];
				opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
				if (!cstr_info->packno) {
					info_PK->start_pos = info_TL->end_header + 1;
				} else if (info_TL->packet[cstr_info->packno-1].end_pos >= (int)cstr_info->tile[tileno].tp[curtp].tp_end_pos){ /* New tile part*/
					info_TL->tp[curtp].tp_numpacks = cstr_info->packno - tp_start_packno; /* Number of packets in previous tile-part*/
          info_TL->tp[curtp].tp_start_pack = tp_start_packno;
					tp_start_packno = cstr_info->packno;
					curtp++;
					info_PK->start_pos = cstr_info->tile[tileno].tp[curtp].tp_end_header+1;
				} else {
					info_PK->start_pos = (cp->tp_on && info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno - 1].end_pos + 1;
				}
				info_PK->end_pos = info_PK->start_pos + e - 1;
				info_PK->end_ph_pos += info_PK->start_pos - 1;	/* End of packet header which now only represents the distance 
																												// to start of packet is incremented by value of start of packet*/
				cstr_info->packno++;
			}
			/* << INDEX */
			
			if (e == -999) {		/* ADD */
				break;
			} else {
				c += e;
			}			
		}
	}
	/* INDEX >> */
	if(cstr_info) {
		cstr_info->tile[tileno].tp[curtp].tp_numpacks = cstr_info->packno - tp_start_packno; /* Number of packets in last tile-part*/
    cstr_info->tile[tileno].tp[curtp].tp_start_pack = tp_start_packno;
	}
	/* << INDEX */

	/* don't forget to release pi */
	pi_destroy(pi, cp, tileno);
	
	if (e == -999) {
		return e;
	}
	
	return (c - src);
}